

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cc
# Opt level: O3

Status __thiscall
google::protobuf::json_internal::JsonLocation::Invalid
          (JsonLocation *this,char *param_2,undefined8 param_3,undefined8 param_4)

{
  char *pcVar1;
  char cVar2;
  uint uVar3;
  byte bVar4;
  size_type sVar5;
  ulong uVar6;
  const_iterator __begin3;
  _Alloc_hider _Var7;
  ulong uVar8;
  string status_message;
  string to_obfuscate;
  long *local_c8;
  undefined8 local_c0;
  long local_b8 [2];
  string local_a8;
  JsonLocation *local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined1 local_70 [32];
  char local_50 [8];
  code *local_48;
  undefined8 *local_40;
  code *local_38;
  
  local_c8 = local_b8;
  local_88 = this;
  local_80 = param_3;
  local_78 = param_4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"invalid JSON","");
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  if (*(long *)(param_2 + 0x18) != 0) {
    local_70._0_8_ = 4;
    local_70._8_8_ = " in ";
    absl::lts_20240722::StrAppend((string *)&local_a8,(AlphaNum *)local_70);
    MessagePath::Describe(*(MessagePath **)(param_2 + 0x18),&local_a8);
    std::__cxx11::string::push_back((char)&local_a8);
  }
  local_70._0_8_ = *(long *)(param_2 + 8) + 1;
  local_70._16_8_ = *(long *)(param_2 + 0x10) + 1;
  local_70._8_8_ = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<unsigned_long>;
  local_70._24_8_ = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<unsigned_long>;
  local_50 = *(char (*) [8])param_2;
  local_48 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<unsigned_long>;
  local_40 = &local_80;
  local_38 = absl::lts_20240722::str_format_internal::FormatArgImpl::
             Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
  absl::lts_20240722::str_format_internal::AppendPack
            (&local_a8," near %zu:%zu (offset %zu): %s",0x1e,local_70,4);
  _Var7._M_p = local_a8._M_dataplus._M_p;
  LOCK();
  UNLOCK();
  if (local_a8._M_string_length == 0) {
    (anonymous_namespace)::
    HardenAgainstHyrumsLaw(std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string&)
    ::kCounterSeed =
         (anonymous_namespace)::
         HardenAgainstHyrumsLaw(std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string&)
         ::kCounterSeed + 1;
    std::__cxx11::string::reserve((ulong)&local_c8);
  }
  else {
    uVar6 = ((long)&(anonymous_namespace)::
                    HardenAgainstHyrumsLaw(std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string&)
                    ::kAslrSeed +
            (anonymous_namespace)::
            HardenAgainstHyrumsLaw(std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string&)
            ::kCounterSeed) * 0x5851f42d4c957f2d + 0x1a08ee1184ba6d32;
    pcVar1 = local_a8._M_dataplus._M_p + local_a8._M_string_length;
    sVar5 = 0;
    do {
      sVar5 = sVar5 + 1;
    } while (local_a8._M_string_length != sVar5);
    (anonymous_namespace)::
    HardenAgainstHyrumsLaw(std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string&)
    ::kCounterSeed =
         (anonymous_namespace)::
         HardenAgainstHyrumsLaw(std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string&)
         ::kCounterSeed + 1;
    std::__cxx11::string::reserve((ulong)&local_c8);
    do {
      cVar2 = *_Var7._M_p;
      std::__cxx11::string::push_back((char)&local_c8);
      if ((cVar2 == ' ') &&
         (uVar6 = uVar6 * 0x5851f42d4c957f2d + 0x14057b7ef767814f,
         uVar3 = (uint)(uVar6 >> 0x2d) ^ (uint)(uVar6 >> 0x1b), bVar4 = (byte)(uVar6 >> 0x3b),
         (uVar3 >> bVar4 | uVar3 << 0x20 - bVar4) * -0x55555555 < 0x55555556)) {
        uVar6 = uVar6 * 0x5851f42d4c957f2d + 0x14057b7ef767814f;
        uVar3 = (uint)(uVar6 >> 0x2d) ^ (uint)(uVar6 >> 0x1b);
        bVar4 = (byte)(uVar6 >> 0x3b);
        uVar8 = (ulong)(((uVar3 >> bVar4 | uVar3 << 0x20 - bVar4) & 1) + 1);
        do {
          std::__cxx11::string::push_back((char)&local_c8);
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
      }
      _Var7._M_p = _Var7._M_p + 1;
    } while (_Var7._M_p != pcVar1);
  }
  absl::lts_20240722::InvalidArgumentError(local_88,local_c0,local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,
                    CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                             local_a8.field_2._M_local_buf[0]) + 1);
  }
  if (local_c8 != local_b8) {
    operator_delete(local_c8,local_b8[0] + 1);
  }
  return (Status)(uintptr_t)local_88;
}

Assistant:

absl::Status JsonLocation::Invalid(absl::string_view message,
                                   SourceLocation sl) const {
  // NOTE: we intentionally do not harden the "invalid JSON" part, so that
  // people have a hope of grepping for it in logs. That part is easy to
  // commit to, as stability goes.
  //
  // This copies the error twice. Because this is the "unhappy" path, this
  // function is cold and can afford the waste.
  std::string status_message = "invalid JSON";
  std::string to_obfuscate;
  if (path != nullptr) {
    absl::StrAppend(&to_obfuscate, " in ");
    path->Describe(to_obfuscate);
    to_obfuscate.push_back(',');
  }
  absl::StrAppendFormat(&to_obfuscate, " near %zu:%zu (offset %zu): %s",
                        line + 1, col + 1, offset, message);
  HardenAgainstHyrumsLaw(to_obfuscate, status_message);

  return absl::InvalidArgumentError(std::move(status_message));
}